

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluateTest.hpp
# Opt level: O2

void Qentem::Test::TestEvaluate8(QTest *test)

{
  bool bVar1;
  double local_58;
  QNumber64 number;
  Value<char> value;
  
  number.Natural = 0xffffffffffffffff;
  value.field_0.array_.storage_ = (Value<char> *)0x0;
  value.field_0._8_8_ = 0;
  value.type_ = Undefined;
  number = TestEvaluate("3*2^3",&value);
  local_58 = 1.18575755001899e-322;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x689);
  number = TestEvaluate("3*2^2+1",&value);
  local_58 = 6.42285339593621e-323;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x68d);
  number = TestEvaluate("3*10%7",&value);
  local_58 = 4.44659081257122e-323;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x691);
  number = TestEvaluate("135/3^3",&value);
  local_58 = 5.0;
  QTest::IsEqual<double,double>(test,&number.Real,&local_58,0x695);
  number = TestEvaluate("18/10%7",&value);
  local_58 = 6.0;
  QTest::IsEqual<double,double>(test,&number.Real,&local_58,0x699);
  number = TestEvaluate("4^2*2",&value);
  local_58 = 1.58101006669199e-322;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x69d);
  number = TestEvaluate("10%7*2",&value);
  local_58 = 2.96439387504748e-323;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x6a1);
  number = TestEvaluate("3^3/4",&value);
  local_58 = 6.75;
  QTest::IsEqual<double,double>(test,&number.Real,&local_58,0x6a5);
  number = TestEvaluate("10%4/2",&value);
  local_58 = 1.0;
  QTest::IsEqual<double,double>(test,&number.Real,&local_58,0x6a9);
  number = TestEvaluate("4+2*2",&value);
  local_58 = 3.95252516672997e-323;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x6ad);
  number = TestEvaluate("10-7*2",&value);
  local_58 = (double)CONCAT44(local_58._4_4_,0xfffffffc);
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x6b1);
  number = TestEvaluate("3+16/4",&value);
  local_58 = 7.0;
  QTest::IsEqual<double,double>(test,&number.Real,&local_58,0x6b5);
  number = TestEvaluate("10-6/3",&value);
  local_58 = 8.0;
  QTest::IsEqual<double,double>(test,&number.Real,&local_58,0x6b9);
  number = TestEvaluate("2*8-2",&value);
  local_58 = 6.91691904177745e-323;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x6bd);
  number = TestEvaluate("3*4-20",&value);
  local_58 = (double)CONCAT44(local_58._4_4_,0xfffffff8);
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x6c1);
  number = TestEvaluate("14/7+3",&value);
  local_58 = 5.0;
  QTest::IsEqual<double,double>(test,&number.Real,&local_58,0x6c5);
  number = TestEvaluate("9/3-4",&value);
  local_58 = -1.0;
  QTest::IsEqual<double,double>(test,&number.Real,&local_58,0x6c9);
  number = TestEvaluate("3+4==7",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x6cd);
  number = TestEvaluate("7-8==-1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x6d1);
  number = TestEvaluate("8-2!=2",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x6d5);
  number = TestEvaluate("7+3!=3",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x6d9);
  number = TestEvaluate("7==3+4",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x6dd);
  number = TestEvaluate("-1==7-8",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x6e1);
  number = TestEvaluate("8!=8-2",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x6e5);
  number = TestEvaluate("7!=7+3",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x6e9);
  bVar1 = TestEvaluate(&number,"7!=10-3",&value);
  local_58 = 0.0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x6ed);
  QTest::IsTrue(test,bVar1,0x6ee);
  bVar1 = TestEvaluate(&number,"7-10!=-3",&value);
  local_58 = 0.0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x6f2);
  QTest::IsTrue(test,bVar1,0x6f3);
  number = TestEvaluate("3+4>=7",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x6f7);
  number = TestEvaluate("3-8>-10",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x6fb);
  number = TestEvaluate("8-2<10",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x6ff);
  number = TestEvaluate("7+3<=10",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x703);
  number = TestEvaluate("7<=3+4",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x707);
  number = TestEvaluate("-1<7+8",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x70b);
  number = TestEvaluate("8>8-2",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x70f);
  number = TestEvaluate("7>=10-3",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x713);
  number = TestEvaluate("1&&1==1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x717);
  number = TestEvaluate("1&&10==10",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x71b);
  number = TestEvaluate("1&&5!=1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x71f);
  number = TestEvaluate("1&&7!=1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x723);
  number = TestEvaluate("0==0&&1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x727);
  number = TestEvaluate("1==1&&1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x72b);
  number = TestEvaluate("1!=0&&1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x72f);
  number = TestEvaluate("0!=1&&1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x733);
  number = TestEvaluate("1||10==1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x737);
  number = TestEvaluate("0||10==10",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x73b);
  number = TestEvaluate("1||5!=1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x73f);
  number = TestEvaluate("0||7!=1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x743);
  number = TestEvaluate("0==0||1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x747);
  number = TestEvaluate("1==1||0",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x74b);
  number = TestEvaluate("1!=0||1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x74f);
  number = TestEvaluate("0!=1||0",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x753);
  number = TestEvaluate("1&&1<=1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x757);
  number = TestEvaluate("1&&3<10",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x75b);
  number = TestEvaluate("1&&5>1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x75f);
  number = TestEvaluate("1&&0>=0",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x763);
  number = TestEvaluate("0<=0&&1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x767);
  number = TestEvaluate("1<2&&1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x76b);
  number = TestEvaluate("1>0&&1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x76f);
  number = TestEvaluate("10>=5&&1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x773);
  number = TestEvaluate("1||10<=1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x777);
  number = TestEvaluate("0||1<10",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x77b);
  number = TestEvaluate("1||5>=10",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x77f);
  number = TestEvaluate("0||7>1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x783);
  number = TestEvaluate("0>=0||1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x787);
  number = TestEvaluate("4>3||0",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x78b);
  number = TestEvaluate("1<0||1",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x78f);
  number = TestEvaluate("0<1||0",&value);
  local_58 = 4.94065645841247e-324;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&number.Natural,(unsigned_long_long *)&local_58,0x793);
  Value<char>::~Value(&value);
  return;
}

Assistant:

static void TestEvaluate8(QTest &test) {
    const Value<char> value{};
    QNumber64         number{-1};
    const char       *content;
    bool              is_valid;

    content = "3*2^3";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 24ULL, __LINE__);

    content = "3*2^2+1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 13ULL, __LINE__);

    content = "3*10%7";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 9ULL, __LINE__);

    content = "135/3^3";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Real, 5.0, __LINE__);

    content = "18/10%7";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Real, 6.0, __LINE__);

    content = "4^2*2";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 32ULL, __LINE__);

    content = "10%7*2";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 6ULL, __LINE__);

    content = "3^3/4";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Real, 6.75, __LINE__);

    content = "10%4/2";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Real, 1.0, __LINE__);

    content = "4+2*2";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 8ULL, __LINE__);

    content = "10-7*2";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -4, __LINE__);

    content = "3+16/4";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Real, 7.0, __LINE__);

    content = "10-6/3";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Real, 8.0, __LINE__);

    content = "2*8-2";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 14ULL, __LINE__);

    content = "3*4-20";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -8, __LINE__);

    content = "14/7+3";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Real, 5.0, __LINE__);

    content = "9/3-4";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Real, -1.0, __LINE__);

    content = "3+4==7";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "7-8==-1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "8-2!=2";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "7+3!=3";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "7==3+4";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "-1==7-8";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "8!=8-2";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "7!=7+3";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content  = "7!=10-3";
    is_valid = TestEvaluate(number, content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);
    test.IsTrue(is_valid, __LINE__);

    content  = "7-10!=-3";
    is_valid = TestEvaluate(number, content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);
    test.IsTrue(is_valid, __LINE__);

    content = "3+4>=7";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "3-8>-10";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "8-2<10";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "7+3<=10";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "7<=3+4";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "-1<7+8";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "8>8-2";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "7>=10-3";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1&&1==1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1&&10==10";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1&&5!=1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1&&7!=1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0==0&&1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1==1&&1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1!=0&&1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0!=1&&1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1||10==1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0||10==10";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1||5!=1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0||7!=1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0==0||1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1==1||0";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1!=0||1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0!=1||0";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1&&1<=1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1&&3<10";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1&&5>1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1&&0>=0";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0<=0&&1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1<2&&1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1>0&&1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "10>=5&&1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1||10<=1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0||1<10";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1||5>=10";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0||7>1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0>=0||1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "4>3||0";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1<0||1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0<1||0";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);
}